

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O3

int main(void)

{
  Am_Slot_Key AVar1;
  Am_Slot_Key AVar2;
  ushort uVar3;
  ushort uVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  Am_Constraint *pAVar7;
  Am_Object AVar8;
  undefined8 uVar9;
  Am_Value_List *this;
  Am_Object AVar10;
  Am_Object AVar11;
  Am_Object AVar12;
  Am_Font bigfont;
  Am_Font aAStack_1c8 [8];
  Am_Object local_1c0;
  Am_Object local_1b8;
  Am_Object local_1b0;
  Am_Object local_1a8;
  Am_Object local_1a0;
  Am_Object local_198;
  Am_Object local_190;
  Am_Object local_188;
  Am_Object local_180;
  Am_Object local_178;
  Am_Object local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100 [2];
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Time local_d0 [16];
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0 [2];
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Formula local_70 [16];
  Am_Formula local_60 [16];
  Am_Formula local_50 [16];
  Am_Formula local_40 [16];
  Am_Formula local_30 [16];
  
  Am_Initialize();
  Am_Font::Am_Font(aAStack_1c8,Am_FONT_SERIF,true,false,false,Am_FONT_LARGE);
  Am_Object::Create((char *)local_b0);
  uVar3 = Am_Object::Set((ushort)local_b0,true,0);
  uVar3 = Am_Object::Set(uVar3,true,0);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,0xcd,0xffffff9c);
  Am_Time::Am_Time(local_d0,0x14);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_d0);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xe9,(ulong)pAVar5);
  Am_Object::Create((char *)local_100);
  pAVar6 = (Am_Object *)
           Am_Object::Set((ushort)local_100,(Am_Method_Wrapper *)0xc8,
                          (ulong)ball_anim_method.from_wrapper);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim_cmd,pAVar6);
  Am_Object::Am_Object(&local_78,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar3,(Am_Object)0xc5,(ulong)&local_78);
  Am_Object::operator=(&anim,pAVar6);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(local_100);
  Am_Time::~Am_Time(local_d0);
  Am_Object::~Am_Object(local_b0);
  Am_Object::Create((char *)&local_80);
  uVar3 = Am_Object::Set((ushort)&local_80,(char *)0x6c,0x106089);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,600);
  uVar3 = Am_Object::Set(uVar3,0x67,0x1c2);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER1_SCORE,0);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER2_SCORE,0);
  AVar1 = LABEL1;
  Am_Object::Create((char *)&local_90);
  uVar4 = Am_Object::Set((ushort)&local_90,100,10);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x106095);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(aAStack_1c8);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_88,pAVar6);
  AVar8.data._2_6_ = 0;
  AVar8.data._0_2_ = AVar1;
  uVar3 = Am_Object::Add_Part(uVar3,AVar8,(ulong)&local_88);
  AVar2 = SCORE1;
  Am_Object::Create((char *)&local_a0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar4 = Am_Object::Set((ushort)&local_a0,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)right_of_label1);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar7);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_b0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)local_b0);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar7);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(aAStack_1c8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_98,pAVar6);
  AVar10.data._2_6_ = 0;
  AVar10.data._0_2_ = AVar2;
  uVar3 = Am_Object::Add_Part(uVar3,AVar10,(ulong)&local_98);
  uVar3 = Am_Object::Set(uVar3,0xa0,10);
  AVar2 = SCORE2;
  Am_Object::Create((char *)&local_c0);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar4 = Am_Object::Set((ushort)&local_c0,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar7);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_d0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)local_d0);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar7);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(aAStack_1c8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_b8,pAVar6);
  AVar11.data._2_6_ = 0;
  AVar11.data._0_2_ = AVar2;
  uVar3 = Am_Object::Add_Part(uVar3,AVar11,(ulong)&local_b8);
  AVar1 = LABEL2;
  Am_Object::Create((char *)&local_e0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_of_score2);
  uVar4 = Am_Object::Set((ushort)&local_e0,(Am_Constraint *)0x64,(ulong)pAVar7);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x106095);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(aAStack_1c8);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_d8,pAVar6);
  AVar12.data._2_6_ = 0;
  AVar12.data._0_2_ = AVar1;
  AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(uVar3,AVar12,(ulong)&local_d8);
  Am_Object::Create((char *)&local_f0);
  uVar3 = Am_Object::Set((ushort)&local_f0,0x65,10);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x94,(ulong)pAVar7);
  uVar3 = Am_Object::Set(uVar3,0x95,10);
  uVar3 = Am_Object::Set(uVar3,true,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_100);
  Am_Object::Create((char *)&local_108);
  uVar4 = Am_Object::Set((ushort)&local_108,(char *)0x150,0x1060bb);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)new_game_method.from_wrapper);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar9 = Am_Value_List::Add(local_100,pAVar5,1,1);
  Am_Object::Create((char *)&local_110);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_110);
  uVar9 = Am_Value_List::Add(uVar9,pAVar5,1,1);
  Am_Object::Create((char *)&local_118);
  uVar4 = Am_Object::Set((ushort)&local_118,(char *)0x150,0x1060d1);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,
                          (ulong)connect_to_remote_method.from_wrapper);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  this = (Am_Value_List *)Am_Value_List::Add(uVar9,pAVar5,1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  Am_Object::Am_Object(&local_e8,pAVar6);
  AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(AVar8,SUB81(&local_e8,0),1);
  Am_Object::Create((char *)&local_128);
  uVar3 = Am_Object::Set((ushort)&local_128,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_30);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(local_30);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar7);
  Am_From_Owner((ushort)local_40,0x67,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(local_40);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar7);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_120,pAVar6);
  AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(AVar8,SUB81(&local_120,0),1);
  Am_Object::Create((char *)&local_138);
  uVar3 = Am_Object::Set((ushort)&local_138,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_50);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(local_50);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar7);
  Am_From_Owner((ushort)local_60,0x67,1.0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(local_60);
  AVar10.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar7);
  Am_Object::Create((char *)&local_148);
  uVar3 = Am_Object::Set((ushort)&local_148,0x65,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar7);
  uVar3 = Am_Object::Set(uVar3,0x66,3);
  Am_From_Owner((ushort)local_70);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(local_70);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar7);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_140,pAVar6);
  AVar10.data = (Am_Object_Data *)Am_Object::Add_Part(AVar10,SUB81(&local_140,0),1);
  Am_Object::Create((char *)&local_158);
  uVar3 = Am_Object::Set((ushort)&local_158,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,10);
  uVar3 = Am_Object::Set(uVar3,0x66,10);
  uVar3 = Am_Object::Set(uVar3,0x67,0x3c);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  AVar11.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Create((char *)&local_168);
  uVar3 = Am_Object::Set((ushort)&local_168,(Am_Method_Wrapper *)0xc8,
                         (ulong)paddle_interim_do.from_wrapper);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,0xca,0);
  Am_Object::Am_Object(&local_160,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar11,SUB81(&local_160,0),1);
  pAVar6 = (Am_Object *)Am_Object::operator=(&paddle1,pAVar6);
  Am_Object::Am_Object(&local_150,pAVar6);
  uVar3 = Am_Object::Add_Part(AVar10,SUB81(&local_150,0),1);
  AVar10.data = (Am_Object_Data *)Am_Object::Set(uVar3,0xa0,10);
  Am_Object::Create((char *)&local_178);
  uVar3 = Am_Object::Set((ushort)&local_178,0x65,200);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar7);
  uVar3 = Am_Object::Set(uVar3,0x66,10);
  uVar3 = Am_Object::Set(uVar3,0x67,0x3c);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  AVar11.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Create((char *)&local_188);
  uVar3 = Am_Object::Set((ushort)&local_188,(Am_Method_Wrapper *)0xc8,
                         (ulong)paddle_interim_do.from_wrapper);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,0xca,0);
  Am_Object::Am_Object(&local_180,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar11,SUB81(&local_180,0),1);
  pAVar6 = (Am_Object *)Am_Object::operator=(&paddle2,pAVar6);
  Am_Object::Am_Object(&local_170,pAVar6);
  AVar10.data = (Am_Object_Data *)Am_Object::Add_Part(AVar10,SUB81(&local_170,0),1);
  Am_Object::Create((char *)&local_198);
  uVar3 = Am_Object::Set((ushort)&local_198,true,0);
  uVar3 = Am_Object::Set(uVar3,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,200);
  uVar3 = Am_Object::Set(uVar3,0x66,0x15);
  uVar3 = Am_Object::Set(uVar3,0x67,0x15);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  AVar11.data = (Am_Object_Data *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_1a0,&anim);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar11,SUB81(&local_1a0,0),1);
  pAVar6 = (Am_Object *)Am_Object::operator=(&ball,pAVar6);
  Am_Object::Am_Object(&local_190,pAVar6);
  AVar10.data = (Am_Object_Data *)Am_Object::Add_Part(AVar10,SUB81(&local_190,0),1);
  Am_Object::Create((char *)&local_1b0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set((ushort)&local_1b0,(Am_Constraint *)0x64,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_Y_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,(ulong)pAVar7);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(aAStack_1c8);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xac,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,100);
  uVar3 = Am_Object::Set(uVar3,0x67,100);
  Am_Object::Create((char *)&local_1b8);
  uVar4 = Am_Object::Set((ushort)&local_1b8,(char *)0x150,0x106106);
  pAVar6 = (Am_Object *)
           Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)start_game.from_wrapper);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xc5,(ulong)pAVar5);
  pAVar6 = (Am_Object *)Am_Object::operator=(&start_button,pAVar6);
  Am_Object::Am_Object(&local_1a8,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar10,SUB81(&local_1a8,0),1);
  pAVar6 = (Am_Object *)Am_Object::operator=(&main_group,pAVar6);
  Am_Object::Am_Object(&local_130,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar8,SUB81(&local_130,0),1);
  Am_Object::operator=(&window,pAVar6);
  Am_Object::~Am_Object(&local_130);
  Am_Object::~Am_Object(&local_1a8);
  Am_Object::~Am_Object(&local_1b8);
  Am_Object::~Am_Object(&local_1b0);
  Am_Object::~Am_Object(&local_190);
  Am_Object::~Am_Object(&local_1a0);
  Am_Object::~Am_Object(&local_198);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_180);
  Am_Object::~Am_Object(&local_188);
  Am_Object::~Am_Object(&local_178);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_160);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&local_158);
  Am_Object::~Am_Object(&local_140);
  Am_Formula::~Am_Formula(local_70);
  Am_Object::~Am_Object(&local_148);
  Am_Formula::~Am_Formula(local_60);
  Am_Formula::~Am_Formula(local_50);
  Am_Object::~Am_Object(&local_138);
  Am_Object::~Am_Object(&local_120);
  Am_Formula::~Am_Formula(local_40);
  Am_Formula::~Am_Formula(local_30);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_118);
  Am_Object::~Am_Object(&local_110);
  Am_Object::~Am_Object(&local_108);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_100);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_b8);
  Am_Formula::~Am_Formula((Am_Formula *)local_d0);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_98);
  Am_Formula::~Am_Formula((Am_Formula *)local_b0);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_80);
  Am_Object::Am_Object(&local_1c0,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_1c0,0),1);
  Am_Object::~Am_Object(&local_1c0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Font::~Am_Font(aAStack_1c8);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();
  Am_Font bigfont(Am_FONT_SERIF, true, false, false, Am_FONT_LARGE);
  anim =
      Am_Animation_Interactor.Create("anim")
          .Set(Am_START_WHEN, false)
          .Set(Am_STOP_WHEN, false)
          .Set(Am_START_WHERE_TEST, true)
          .Set(Am_RUN_ALSO, true)
          .Set(Am_PRIORITY, -100)            //let other interactors run
          .Set(Am_REPEAT_DELAY, Am_Time(20)) //milliseconds between increments
          .Set_Part(Am_COMMAND,
                    anim_cmd =
                        Am_Animation_Command.Create("anim_cmd")
                            .Set(Am_INTERIM_DO_METHOD, ball_anim_method));
  window =
      Am_Window.Create("Main_Window")
          .Set(Am_TITLE, "Amulet PONG")
          .Set(Am_FILL_STYLE, Am_Amulet_Purple)
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, 450)
          .Add(PLAYER1_SCORE, 0)
          .Add(PLAYER2_SCORE, 0)
          .Add_Part(LABEL1, Am_Text.Create("label1")
                                .Set(Am_LEFT, 10)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Red))
          .Add_Part(SCORE1, Am_Text.Create("score1")
                                .Set(Am_LINE_STYLE, Am_Red)
                                .Set(Am_LEFT, right_of_label1)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER1_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Set(Am_RIGHT_OFFSET, 10)
          .Add_Part(SCORE2, Am_Text.Create("score2")
                                .Set(Am_LINE_STYLE, Am_Blue)
                                .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER2_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Add_Part(LABEL2, Am_Text.Create("label2")
                                .Set(Am_LEFT, left_of_score2)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Blue))
          .Add_Part(
              Am_Button_Panel.Create("buttons")
                  .Set(Am_TOP, score_top - 2)
                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_H_SPACING, 10)
                  .Set(Am_FIXED_WIDTH, false)
                  .Set(Am_ITEMS,
                       Am_Value_List()
                           .Add(Am_Command.Create("new game")
                                    .Set(Am_LABEL, "New Game")
                                    .Set(Am_DO_METHOD, new_game_method))
                           .Add(Am_Quit_No_Ask_Command.Create())
                           .Add(Am_Command.Create("connect user")
                                    .Set(Am_LABEL, "Connect to Remote User")
                                    .Set(Am_DO_METHOD,
                                         connect_to_remote_method))))
          .Add_Part(Am_Border_Rectangle.Create()
                        .Set(Am_LEFT, 0)
                        .Set(Am_TOP, top_height)
                        .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                        .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                        .Set(Am_FILL_STYLE, Am_Black))
          .Add_Part(
              main_group =
                  Am_Group.Create("main group")
                      .Set(Am_LEFT, 0)
                      .Set(Am_TOP, top_height)
                      .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                      .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                      .Add_Part(
                          Am_Rectangle.Create("center")
                              .Set(Am_TOP, 0)
                              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                              .Set(Am_WIDTH, 3)
                              .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                              .Set(Am_LINE_STYLE, Am_No_Style)
                              .Set(Am_FILL_STYLE, Am_White))
                      .Add_Part(paddle1 =
                                    Am_Rectangle.Create()
                                        .Set(Am_TOP, 200)
                                        .Set(Am_LEFT, 10)
                                        .Set(Am_WIDTH, paddle_width)
                                        .Set(Am_HEIGHT, paddle_height)
                                        .Set(Am_LINE_STYLE, Am_No_Style)
                                        .Set(Am_FILL_STYLE, Am_Red)
                                        .Add_Part(Am_Move_Grow_Interactor
                                                      .Create("paddle1move")
                                                      .Set(Am_INTERIM_DO_METHOD,
                                                           paddle_interim_do)
                                                      .Set(Am_DO_METHOD, 0L)))
                      .Set(Am_RIGHT_OFFSET, 10)
                      .Add_Part(
                          paddle2 =
                              Am_Rectangle.Create()
                                  .Set(Am_TOP, 200)
                                  .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                                  .Set(Am_WIDTH, paddle_width)
                                  .Set(Am_HEIGHT, paddle_height)
                                  .Set(Am_LINE_STYLE, Am_No_Style)
                                  .Set(Am_FILL_STYLE, Am_Blue)
                                  .Add_Part(Am_Move_Grow_Interactor
                                                .Create("paddle1move")
                                                .Set(Am_INTERIM_DO_METHOD,
                                                     paddle_interim_do)
                                                .Set(Am_DO_METHOD, 0L)))
                      .Add_Part(ball = Am_Arc.Create()
                                           .Set(Am_VISIBLE, false)
                                           .Set(Am_TOP, 200)
                                           .Set(Am_LEFT, 200)
                                           .Set(Am_WIDTH, ball_size)
                                           .Set(Am_HEIGHT, ball_size)
                                           .Set(Am_LINE_STYLE, Am_No_Style)
                                           .Set(Am_FILL_STYLE, Am_Yellow)
                                           .Add_Part(anim))

                      .Add_Part(
                          start_button =
                              Am_Button.Create()
                                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                                  .Set(Am_TOP, Am_Center_Y_Is_Center_Of_Owner)
                                  .Set(Am_FONT, bigfont)
                                  .Set(Am_WIDTH, 100)
                                  .Set(Am_HEIGHT, 100)
                                  .Set(Am_COMMAND,
                                       Am_Command.Create()
                                           .Set(Am_LABEL, "Start!")
                                           .Set(Am_DO_METHOD, start_game))))

      ;
  Am_Screen.Add_Part(window);

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}